

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

Vec_Ptr_t * Bac_PtrTransformNtk(Vec_Ptr_t *vNtk,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  char *__s;
  Vec_Ptr_t *vSig;
  Vec_Ptr_t *vBoxes;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  Vec_Ptr_t *pVVar5;
  undefined8 *puVar6;
  
  iVar1 = vNtk->nSize;
  if ((((0 < (long)iVar1) && (iVar1 != 1)) && (2 < iVar1)) && (4 < iVar1)) {
    ppvVar3 = vNtk->pArray;
    __s = (char *)*ppvVar3;
    pVVar5 = (Vec_Ptr_t *)ppvVar3[1];
    vSig = (Vec_Ptr_t *)ppvVar3[2];
    vBoxes = (Vec_Ptr_t *)ppvVar3[4];
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nSize = 0;
    pVVar2->nCap = iVar1;
    ppvVar3 = (void **)malloc((long)iVar1 << 3);
    pVVar2->pArray = ppvVar3;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar4 = strlen(__s);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,__s);
    }
    ppvVar3 = pVVar2->pArray;
    pVVar2->nSize = 1;
    *ppvVar3 = __dest;
    pVVar5 = Bac_PtrTransformSigs(pVVar5);
    if (pVVar2->nCap == 1) {
      ppvVar3 = (void **)realloc(ppvVar3,0x80);
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = 0x10;
    }
    ppvVar3 = pVVar2->pArray;
    pVVar2->nSize = 2;
    ppvVar3[1] = pVVar5;
    pVVar5 = Bac_PtrTransformSigs(vSig);
    if (pVVar2->nCap == 2) {
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = 0x10;
    }
    ppvVar3 = pVVar2->pArray;
    pVVar2->nSize = 3;
    ppvVar3[2] = pVVar5;
    puVar6 = (undefined8 *)malloc(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    if (pVVar2->nCap == 3) {
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = 0x10;
    }
    ppvVar3 = pVVar2->pArray;
    pVVar2->nSize = 4;
    ppvVar3[3] = puVar6;
    pVVar5 = Bac_PtrTransformBoxes(vBoxes,vGatesNames);
    if (pVVar2->nCap == 4) {
      if (ppvVar3 == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(ppvVar3,0x80);
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = 0x10;
    }
    pVVar2->nSize = 5;
    pVVar2->pArray[4] = pVVar5;
    return pVVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformNtk( Vec_Ptr_t * vNtk, Vec_Ptr_t * vGatesNames )
{
    char * pName = (char *)Vec_PtrEntry(vNtk, 0);
    Vec_Ptr_t * vInputs  = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1);
    Vec_Ptr_t * vOutputs = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2);
    Vec_Ptr_t * vBoxes   = (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 4);
    Vec_Ptr_t * vNew     = Vec_PtrAllocExact( Vec_PtrSize(vNtk) );
    Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vInputs) );
    Vec_PtrPush( vNew, Bac_PtrTransformSigs(vOutputs) );
    Vec_PtrPush( vNew, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNew, Bac_PtrTransformBoxes(vBoxes, vGatesNames) );
    return vNew;
}